

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_encode.cpp
# Opt level: O1

void __thiscall
ktx::CommandEncode::OptionsEncode::process
          (OptionsEncode *this,Options *param_1,ParseResult *args,Reporter *report)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  pointer pcVar3;
  VkFormat format;
  OptionValue *pOVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> formatStr;
  allocator<char> local_92;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,kCodec,(allocator<char> *)&local_70);
  pOVar4 = cxxopts::ParseResult::operator[](args,&local_90);
  if (pOVar4->m_count == 0) {
    bVar6 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,kFormat,&local_91);
    pOVar4 = cxxopts::ParseResult::operator[](args,&local_50);
    bVar6 = pOVar4->m_count != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    Reporter::fatal_usage<char_const(&)[51]>
              (report,(char (*) [51])"Format and codec can\'t be both specified together.");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,kFormat,(allocator<char> *)&local_70);
  pOVar4 = cxxopts::ParseResult::operator[](args,&local_90);
  sVar2 = pOVar4->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (sVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,kFormat,&local_92);
    pOVar4 = cxxopts::ParseResult::operator[](args,&local_70);
    pbVar5 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar4);
    pcVar3 = (pbVar5->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + pbVar5->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    format = stringToVkFormat(local_90._M_dataplus._M_p);
    if (format == VK_FORMAT_UNDEFINED) {
      Reporter::fatal_usage<char_const(&)[54],std::__cxx11::string_const&>
                (report,(char (*) [54])"The requested format is invalid or unsupported: \"{}\".",
                 &local_90);
    }
    this->vkFormat = format;
    bVar6 = isFormatAstc(format);
    if (!bVar6) {
      Reporter::fatal_usage<char_const(&)[48]>
                (report,(char (*) [48])"Optional option \'format\' is not an ASTC format.");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CommandEncode::OptionsEncode::process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
    if (args[kCodec].count() && args[kFormat].count())
        report.fatal_usage("Format and codec can't be both specified together.");

    if (args[kFormat].count()) {
        const auto formatStr = args[kFormat].as<std::string>();
        const auto parsedVkFormat = parseVkFormat(formatStr);
        if (!parsedVkFormat)
            report.fatal_usage("The requested format is invalid or unsupported: \"{}\".", formatStr);

        vkFormat = *parsedVkFormat;

        if (!isFormatAstc(vkFormat)) {
            report.fatal_usage("Optional option 'format' is not an ASTC format.");
        }
    }
}